

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall
Parser::FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
          (Parser *this,ParseNodePtr pnodeScopeList,anon_class_16_2_9bc0f637 fn)

{
  Scope *pSVar1;
  Scope *pSVar2;
  code *pcVar3;
  anon_class_16_2_9bc0f637 fn_00;
  anon_class_16_2_9bc0f637 fn_01;
  anon_class_16_2_9bc0f637 fn_02;
  bool bVar4;
  ParseNodeFnc *pPVar5;
  ParseNodeCatch *pPVar6;
  ParseNodeBlock *pPVar7;
  BlockInfoStack *pBVar8;
  ParseNodeWith *pPVar9;
  undefined4 *puVar10;
  ParseNodeBlock *pnodeBlockScope;
  ParseNodeBlock *pnodeBlock;
  ParseNodePtr pnodeScope;
  Scope *origCurrentScope;
  Scope *scope;
  ParseNodePtr pnodeScopeList_local;
  Parser *this_local;
  anon_class_16_2_9bc0f637 fn_local;
  
  fn_local.this = (Parser *)fn.parseContext;
  this_local = fn.this;
  pSVar1 = this->m_currentScope;
  pnodeBlock = (ParseNodeBlock *)pnodeScopeList;
  do {
    if (pnodeBlock == (ParseNodeBlock *)0x0) {
      return;
    }
    switch((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop) {
    case knopFncDecl:
      pPVar5 = ParseNode::AsParseNodeFnc((ParseNode *)pnodeBlock);
      FinishDeferredFunction::anon_class_16_2_9bc0f637::operator()
                ((anon_class_16_2_9bc0f637 *)&this_local,pPVar5);
      pPVar5 = ParseNode::AsParseNodeFnc((ParseNode *)pnodeBlock);
      pnodeBlock = (ParseNodeBlock *)pPVar5->pnodeNext;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x2d40,"(false)","Unexpected node with scope list");
      if (bVar4) {
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
        return;
      }
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    case knopBlock:
      pPVar7 = ParseNode::AsParseNodeBlock((ParseNode *)pnodeBlock);
      this->m_nextBlockId = pPVar7->blockId + 1;
      PushBlockInfo(this,pPVar7);
      pSVar2 = pPVar7->scope;
      if ((pSVar2 != (Scope *)0x0) && (pSVar2 != pSVar1)) {
        PushScope(this,pSVar2);
      }
      fn_02.parseContext = (ParseContext *)fn_local.this;
      fn_02.this = this_local;
      FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                (this,pPVar7->pnodeScopes,fn_02);
      if ((pSVar2 != (Scope *)0x0) && (pSVar2 != pSVar1)) {
        pBVar8 = GetCurrentBlockInfo(this);
        BindPidRefs<false>(this,pBVar8,this->m_nextBlockId - 1);
        PopScope(this,pSVar2);
      }
      PopBlockInfo(this);
      pnodeBlock = (ParseNodeBlock *)pPVar7->pnodeNext;
      break;
    case knopWith:
      pPVar7 = CreateBlockNode(this,Regular);
      PushBlockInfo(this,pPVar7);
      PushDynamicBlock(this);
      pPVar9 = ParseNode::AsParseNodeWith((ParseNode *)pnodeBlock);
      fn_00.parseContext = (ParseContext *)fn_local.this;
      fn_00.this = this_local;
      FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                (this,pPVar9->pnodeScopes,fn_00);
      PopBlockInfo(this);
      pPVar9 = ParseNode::AsParseNodeWith((ParseNode *)pnodeBlock);
      pnodeBlock = (ParseNodeBlock *)pPVar9->pnodeNext;
      break;
    case knopCatch:
      pPVar6 = ParseNode::AsParseNodeCatch((ParseNode *)pnodeBlock);
      pSVar2 = pPVar6->scope;
      if (pSVar2 != (Scope *)0x0) {
        PushScope(this,pSVar2);
      }
      pPVar7 = CreateBlockNode(this,Regular);
      pPVar7->scope = pSVar2;
      PushBlockInfo(this,pPVar7);
      pPVar6 = ParseNode::AsParseNodeCatch((ParseNode *)pnodeBlock);
      fn_01.parseContext = (ParseContext *)fn_local.this;
      fn_01.this = this_local;
      FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                (this,pPVar6->pnodeScopes,fn_01);
      if (pSVar2 != (Scope *)0x0) {
        pBVar8 = GetCurrentBlockInfo(this);
        BindPidRefs<false>(this,pBVar8,this->m_nextBlockId - 1);
        PopScope(this,pSVar2);
      }
      PopBlockInfo(this);
      pPVar6 = ParseNode::AsParseNodeCatch((ParseNode *)pnodeBlock);
      pnodeBlock = (ParseNodeBlock *)pPVar6->pnodeNext;
    }
  } while( true );
}

Assistant:

void Parser::FinishFunctionsInScope(ParseNodePtr pnodeScopeList, Fn fn)
{
    Scope * scope;
    Scope * origCurrentScope = this->m_currentScope;
    ParseNodePtr pnodeScope;
    ParseNodeBlock * pnodeBlock;
    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        switch (pnodeScope->nop)
        {
        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            m_nextBlockId = pnodeBlockScope->blockId + 1;
            PushBlockInfo(pnodeBlockScope);
            scope = pnodeBlockScope->scope;
            if (scope && scope != origCurrentScope)
            {
                PushScope(scope);
            }
            FinishFunctionsInScope(pnodeBlockScope->pnodeScopes, fn);
            if (scope && scope != origCurrentScope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeBlockScope->pnodeNext;
            break;
        }
        case knopFncDecl:
            fn(pnodeScope->AsParseNodeFnc());
            pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
            break;

        case knopCatch:
            scope = pnodeScope->AsParseNodeCatch()->scope;
            if (scope)
            {
                PushScope(scope);
            }
            pnodeBlock = CreateBlockNode(PnodeBlockType::Regular);
            pnodeBlock->scope = scope;
            PushBlockInfo(pnodeBlock);
            FinishFunctionsInScope(pnodeScope->AsParseNodeCatch()->pnodeScopes, fn);
            if (scope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            PushBlockInfo(CreateBlockNode());
            PushDynamicBlock();
            FinishFunctionsInScope(pnodeScope->AsParseNodeWith()->pnodeScopes, fn);
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;

        default:
            AssertMsg(false, "Unexpected node with scope list");
            return;
        }
    }
}